

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

void __thiscall
std::tr1::
tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
::tuple(tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
        *this,tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
              *t)

{
  testing::Matcher<char_*>::Matcher(&this->f0_,&t->f0_);
  testing::Matcher<unsigned_long>::Matcher(&this->f1_,&t->f1_);
  return;
}

Assistant:

tuple(const tuple& t) : f0_(t.f0_), f1_(t.f1_) {}